

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
cfd::core::ConfidentialTransaction::GetTxOutIndexList
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ConfidentialTransaction *this,Script *locking_script)

{
  pointer pCVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  __type _Var3;
  CfdException *this_00;
  uint local_b4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b0;
  string search_str;
  Script local_88;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = __return_storage_ptr__;
  Script::GetHex_abi_cxx11_(&search_str,locking_script);
  local_b4 = 0;
  while( true ) {
    pvVar2 = local_b0;
    pCVar1 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((uint)(((long)(this->vout_).
                      super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0xf8) <= local_b4
       ) break;
    AbstractTxOut::GetLockingScript(&local_88,&pCVar1[local_b4].super_AbstractTxOut);
    Script::GetHex_abi_cxx11_(&local_50,&local_88);
    _Var3 = ::std::operator==(&search_str,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    Script::~Script(&local_88);
    if (_Var3) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_b0,&local_b4);
    }
    local_b4 = local_b4 + 1;
  }
  if ((local_b0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (local_b0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::~string((string *)&search_str);
    return pvVar2;
  }
  local_88._vptr_Script = (_func_int **)0x4f4a79;
  local_88.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5d6;
  local_88.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "GetTxOutIndexList";
  logger::warn<>((CfdSourceLocation *)&local_88,"locking script is not found.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_88,"locking script is not found.",(allocator *)&local_50);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_88);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<uint32_t> ConfidentialTransaction::GetTxOutIndexList(
    const Script &locking_script) const {
  std::vector<uint32_t> result;
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    if (search_str == vout_[index].GetLockingScript().GetHex()) {
      result.push_back(index);
    }
  }
  if (result.empty()) {
    warn(CFD_LOG_SOURCE, "locking script is not found.");
    throw CfdException(
        kCfdIllegalArgumentError, "locking script is not found.");
  }
  return result;
}